

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TracerUtil.h
# Opt level: O0

void __thiscall
jaegertracing::testutils::TracerUtil::ResourceHandle::~ResourceHandle(ResourceHandle *this)

{
  shared_ptr<opentracing::v3::Tracer> local_30;
  shared_ptr<opentracing::v3::Tracer> local_20;
  ResourceHandle *local_10;
  ResourceHandle *this_local;
  
  local_10 = this;
  opentracing::v3::MakeNoopTracer();
  opentracing::v3::Tracer::InitGlobal(&local_20,&local_30);
  std::shared_ptr<opentracing::v3::Tracer>::~shared_ptr(&local_20);
  std::shared_ptr<opentracing::v3::Tracer>::~shared_ptr(&local_30);
  std::shared_ptr<jaegertracing::testutils::MockAgent>::~shared_ptr(&this->_mockAgent);
  return;
}

Assistant:

~ResourceHandle()
    {
        opentracing::Tracer::InitGlobal(opentracing::MakeNoopTracer());
    }